

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

mz_bool mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint src_file_index)

{
  ushort uVar1;
  int iVar2;
  mz_zip_internal_state *pArray;
  mz_zip_internal_state *pmVar3;
  mz_uint64 cur_file_ofs;
  undefined8 uVar4;
  mz_uint64 mVar5;
  mz_uint n;
  mz_bool mVar6;
  uint uVar7;
  mz_zip_error mVar8;
  size_t sVar9;
  int *piVar10;
  size_t sVar11;
  short *psVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  void *pvVar17;
  long lVar18;
  ulong uVar19;
  void *pvVar20;
  int *pCentral_dir_header;
  short *psVar21;
  bool bVar22;
  ulong local_590;
  ulong local_580;
  ulong local_578;
  void *local_570;
  uint local_554;
  ulong local_550;
  mz_zip_array local_548;
  ulong local_528;
  ulong local_520;
  mz_zip_array local_518 [2];
  mz_uint32 local_header_u32 [8];
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined4 uStack_4a8;
  undefined4 local_4a4;
  undefined4 uStack_4a0;
  undefined2 uStack_49c;
  undefined2 local_49a;
  undefined6 uStack_498;
  undefined4 uStack_492;
  undefined4 uStack_48e;
  mz_zip_archive_file_stat src_file_stat;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pArray = pZip->m_pState;
  if (((((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
       (pSource_zip->m_pRead == (mz_file_read_func)0x0)) ||
      ((pmVar3 = pSource_zip->m_pState, pmVar3->m_zip64 != 0 && (pArray->m_zip64 == 0)))) ||
     ((pSource_zip->m_total_files <= src_file_index ||
      (pvVar17 = (pmVar3->m_central_dir).m_p, pvVar17 == (void *)0x0)))) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  pCentral_dir_header =
       (int *)((long)pvVar17 +
              (ulong)*(uint *)((long)(pmVar3->m_central_dir_offsets).m_p + (ulong)src_file_index * 4
                              ));
  if (*pCentral_dir_header != 0x2014b50) {
LAB_00466420:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  uVar1 = *(ushort *)(pCentral_dir_header + 7);
  local_520 = (ulong)*(ushort *)(pCentral_dir_header + 8);
  local_550 = (ulong)*(ushort *)((long)pCentral_dir_header + 0x1e);
  uVar13 = (ulong)((uint)*(ushort *)(pCentral_dir_header + 8) + (uint)uVar1 +
                  (uint)*(ushort *)((long)pCentral_dir_header + 0x1e));
  if (((pArray->m_central_dir).m_size + uVar13) - 0xffffffb1 < 0xffffffff00000001)
  goto LAB_004661c3;
  n = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);
  if (pArray->m_zip64 == 0) {
    if (pZip->m_total_files == 0xffff) goto LAB_00466438;
  }
  else if (pZip->m_total_files == 0xffffffff) {
LAB_00466438:
    pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    return 0;
  }
  mVar6 = mz_zip_file_stat_internal
                    (pSource_zip,src_file_index,(mz_uint8 *)pCentral_dir_header,&src_file_stat,
                     (mz_bool *)0x0);
  mVar5 = src_file_stat.m_local_header_ofs;
  if (mVar6 == 0) {
    return 0;
  }
  cur_file_ofs = pZip->m_archive_size;
  sVar9 = (*pSource_zip->m_pRead)
                    (pSource_zip->m_pIO_opaque,src_file_stat.m_local_header_ofs,local_header_u32,
                     0x1e);
  if (sVar9 != 0x1e) goto LAB_0046689b;
  if (local_header_u32[0] != 0x4034b50) goto LAB_00466420;
  uVar19 = (ulong)(ushort)local_header_u32[7];
  lVar18 = src_file_stat.m_comp_size + local_header_u32[6]._2_2_;
  if (((ushort)local_header_u32[7] == 0) ||
     ((local_header_u32._18_4_ != -1 && (local_header_u32._22_4_ != -1)))) {
    bVar22 = false;
  }
  else {
    local_518[0].m_capacity = 0;
    local_518[0].m_p._0_4_ = 0;
    local_518[0].m_p._4_4_ = 0;
    local_518[0].m_size._0_4_ = 0;
    local_518[0].m_size._4_1_ = 0;
    local_518[0].m_size._5_1_ = 0;
    local_518[0].m_size._6_1_ = 0;
    local_518[0].m_size._7_1_ = 0;
    local_518[0].m_element_size = 1;
    local_518[0]._28_4_ = 0;
    mVar6 = mz_zip_array_ensure_capacity(pZip,local_518,uVar19,0);
    if (mVar6 == 0) {
      mVar8 = MZ_ZIP_ALLOC_FAILED;
LAB_0046650e:
      pZip->m_last_error = mVar8;
      return 0;
    }
    psVar12 = (short *)CONCAT44(local_518[0].m_p._4_4_,local_518[0].m_p._0_4_);
    sVar9 = (*pSource_zip->m_pRead)
                      (pSource_zip->m_pIO_opaque,
                       src_file_stat.m_local_header_ofs + local_header_u32[6]._2_2_ + 0x1e,psVar12,
                       uVar19);
    if (sVar9 != uVar19) {
      mVar8 = MZ_ZIP_FILE_READ_FAILED;
LAB_00466502:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,psVar12);
      goto LAB_0046650e;
    }
    mVar8 = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    uVar16 = uVar19;
    psVar21 = psVar12;
    do {
      uVar7 = (uint)uVar16;
      if (uVar7 < 4) goto LAB_00466502;
      uVar15 = (ushort)psVar21[1] + 4;
      if (uVar7 < uVar15) goto LAB_00466502;
      bVar22 = *psVar21 == 1;
      if (bVar22) {
        if ((ushort)psVar21[1] < 0x10) goto LAB_00466502;
        break;
      }
      psVar21 = (short *)((long)psVar21 + (ulong)uVar15);
      uVar16 = (ulong)(uVar7 - uVar15);
    } while (uVar7 - uVar15 != 0);
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,psVar12);
  }
  uVar19 = lVar18 + uVar19;
  if ((pArray->m_zip64 == 0) &&
     (0xfffffffe < (pArray->m_central_dir).m_size + uVar13 + n + cur_file_ofs + uVar19 + 0xb2)) {
    pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
    return 0;
  }
  mVar6 = mz_zip_writer_write_zeros(pZip,cur_file_ofs,n);
  if (mVar6 == 0) {
    return 0;
  }
  uVar16 = cur_file_ofs + n;
  if ((pZip->m_file_offset_alignment != 0) && ((pZip->m_file_offset_alignment - 1 & uVar16) != 0)) {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/miniz.c"
                  ,0x1bfe,
                  "mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *, mz_zip_archive *, mz_uint)"
                 );
  }
  sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar16,local_header_u32,0x1e);
  if (sVar9 != 0x1e) goto LAB_00466bb4;
  uVar14 = 0x10000;
  if (uVar19 < 0x10000) {
    uVar14 = uVar19;
  }
  sVar9 = 0x20;
  if (0x20 < uVar14) {
    sVar9 = uVar14;
  }
  piVar10 = (int *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,sVar9);
  if (piVar10 == (int *)0x0) goto LAB_00466c5e;
  local_570 = (void *)(mVar5 + 0x1e);
  local_580 = uVar16 + 0x1e;
  sVar9 = uVar16;
  for (; uVar19 != 0; uVar19 = uVar19 - sVar9) {
    sVar9 = 0x10000;
    if (uVar19 < 0x10000) {
      sVar9 = uVar19;
    }
    sVar11 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,(mz_uint64)local_570,piVar10,sVar9);
    if (sVar11 != sVar9) goto LAB_00466890;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_580,piVar10,sVar9);
    if (sVar11 != sVar9) goto LAB_00466ba9;
    local_570 = (void *)((long)local_570 + sVar9);
    local_580 = local_580 + sVar9;
  }
  local_554 = (uint)sVar9;
  if ((local_header_u32[1]._2_1_ & 8) != 0) {
    if ((bool)(~bVar22 & pSource_zip->m_pState->m_zip64 == 0)) {
      sVar9 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,(mz_uint64)local_570,piVar10,0x10);
      if (sVar9 == 0x10) {
        if (pZip->m_pState->m_zip64 == 0) {
          local_554 = (uint)(*piVar10 == 0x8074b50) * 4 + 0xc;
        }
        else {
          uVar19 = (ulong)(*piVar10 == 0x8074b50);
          uVar4 = *(undefined8 *)(piVar10 + uVar19);
          *piVar10 = 0x8074b50;
          iVar2 = piVar10[uVar19 + 2];
          *(undefined8 *)(piVar10 + 1) = uVar4;
          piVar10[3] = 0;
          piVar10[4] = iVar2;
          piVar10[5] = 0;
          local_554 = 0x18;
        }
        goto LAB_00466b80;
      }
    }
    else {
      sVar9 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,(mz_uint64)local_570,piVar10,0x18);
      if (sVar9 == 0x18) {
        local_554 = (uint)(*piVar10 == 0x8074b50) * 4 + 0x14;
LAB_00466b80:
        uVar19 = (ulong)local_554;
        sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_580,piVar10,uVar19);
        if (sVar9 != uVar19) {
LAB_00466ba9:
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar10);
LAB_00466bb4:
          pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
          return 0;
        }
        local_580 = local_580 + uVar19;
        goto LAB_00466528;
      }
    }
LAB_00466890:
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar10);
LAB_0046689b:
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
    return 0;
  }
LAB_00466528:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar10);
  uVar19 = (pArray->m_central_dir).m_size;
  local_4b8 = *(undefined8 *)pCentral_dir_header;
  uStack_4b0 = *(undefined8 *)(pCentral_dir_header + 2);
  uVar4 = *(undefined8 *)(pCentral_dir_header + 6);
  uStack_498 = (undefined6)((ulong)*(undefined8 *)((long)pCentral_dir_header + 0x1e) >> 0x10);
  uStack_4a8 = (undefined4)*(undefined8 *)(pCentral_dir_header + 4);
  local_4a4 = (undefined4)((ulong)*(undefined8 *)(pCentral_dir_header + 4) >> 0x20);
  uStack_4a0 = (undefined4)uVar4;
  uStack_49c = (undefined2)((ulong)uVar4 >> 0x20);
  local_49a = (undefined2)((ulong)uVar4 >> 0x30);
  uStack_492 = (undefined4)*(undefined8 *)((long)pCentral_dir_header + 0x26);
  if (pArray->m_zip64 == 0) {
    if ((local_580 >> 0x20 != 0) || (0xfffffffe < uVar16)) {
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      return 0;
    }
    _uStack_492 = CONCAT44((int)uVar16,uStack_492);
    uVar16 = uVar19 + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar16) &&
       (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar16,1), mVar6 == 0))
    goto LAB_00466c5e;
    (pArray->m_central_dir).m_size = uVar16;
    uVar16 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(uVar19 * uVar16 + (long)(pArray->m_central_dir).m_p),&local_4b8,uVar16 * 0x2e);
    sVar9 = (pArray->m_central_dir).m_size;
    uVar16 = uVar13 + sVar9;
    if ((uVar16 <= (pArray->m_central_dir).m_capacity) ||
       (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar16,1), mVar6 != 0)) {
      (pArray->m_central_dir).m_size = uVar16;
      if (uVar13 != 0) {
        uVar16 = (ulong)(pArray->m_central_dir).m_element_size;
        memcpy((void *)(sVar9 * uVar16 + (long)(pArray->m_central_dir).m_p),
               (void *)((long)pCentral_dir_header + 0x2e),uVar13 * uVar16);
LAB_00466b2d:
        uVar16 = (pArray->m_central_dir).m_size;
      }
      if (0xfffffffe < uVar16) {
        if ((uVar19 <= (pArray->m_central_dir).m_capacity) ||
           (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar19,0), mVar6 != 0))
        {
          (pArray->m_central_dir).m_size = uVar19;
        }
LAB_004661c3:
        pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
        return 0;
      }
      local_554 = (uint)uVar19;
      sVar9 = (pArray->m_central_dir_offsets).m_size;
      uVar13 = sVar9 + 1;
      if ((uVar13 <= (pArray->m_central_dir_offsets).m_capacity) ||
         (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar13,1),
         mVar6 != 0)) {
        (pArray->m_central_dir_offsets).m_size = uVar13;
        uVar13 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
        memcpy((void *)(sVar9 * uVar13 + (long)(pArray->m_central_dir_offsets).m_p),&local_554,
               uVar13);
        pZip->m_total_files = pZip->m_total_files + 1;
        pZip->m_archive_size = local_580;
        return 1;
      }
    }
    if ((uVar19 <= (pArray->m_central_dir).m_capacity) ||
       (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar19,0), mVar6 != 0)) {
      (pArray->m_central_dir).m_size = uVar19;
    }
LAB_00466c5e:
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    return 0;
  }
  local_548.m_capacity = 0;
  local_548.m_p = (void *)0x0;
  local_548.m_size = 0;
  local_548._24_8_ = 1;
  local_4a4 = 0xffffffff;
  uStack_4a0 = 0xffffffff;
  _uStack_492 = CONCAT44(0xffffffff,uStack_492);
  mVar6 = mz_zip_array_ensure_capacity(pZip,&local_548,(ulong)((int)local_550 + 0x40),0);
  if (mVar6 == 0) {
LAB_004668ce:
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
LAB_004668de:
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_548.m_p);
    return 0;
  }
  local_548.m_size = 0;
  local_518[0].m_p._4_4_ = (undefined4)src_file_stat.m_uncomp_size;
  local_518[0].m_size._0_4_ = (undefined4)(src_file_stat.m_uncomp_size >> 0x20);
  local_518[0].m_size._4_1_ = (undefined1)src_file_stat.m_comp_size;
  local_518[0].m_size._5_1_ = (undefined1)(src_file_stat.m_comp_size >> 8);
  local_518[0].m_size._6_1_ = (undefined1)(src_file_stat.m_comp_size >> 0x10);
  local_518[0].m_size._7_1_ = (undefined1)(src_file_stat.m_comp_size >> 0x18);
  local_518[0].m_capacity =
       CONCAT17((char)(uVar16 >> 0x18),
                CONCAT16((char)(uVar16 >> 0x10),
                         CONCAT15((char)(uVar16 >> 8),
                                  CONCAT14((char)uVar16,(int)(src_file_stat.m_comp_size >> 0x20)))))
  ;
  local_518[0].m_element_size = (mz_uint)(uVar16 >> 0x20);
  local_518[0].m_p._0_4_ = 0x180001;
  if ((local_548.m_capacity < 0x1c) &&
     (mVar6 = mz_zip_array_ensure_capacity(pZip,&local_548,0x1c,1), mVar6 == 0)) goto LAB_004668ce;
  psVar12 = (short *)((long)pCentral_dir_header + (ulong)uVar1 + 0x2e);
  local_548.m_size = 0x1c;
  local_570 = local_548.m_p;
  local_528 = (ulong)uVar1;
  memcpy(local_548.m_p,local_518,(local_548._24_8_ & 0xffffffff) * 0x1c);
  if ((int)local_550 == 0) {
    uVar13 = 0x1c;
  }
  else {
    local_578 = 0x1c;
    local_590 = local_550 & 0xffffffff;
    psVar21 = psVar12;
    do {
      if ((uint)local_590 < 4) {
LAB_004668d7:
        pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
        goto LAB_004668de;
      }
      lVar18 = (ulong)(ushort)psVar21[1] + 4;
      if ((uint)local_590 < (uint)lVar18) goto LAB_004668d7;
      if (*psVar21 != 1) {
        uVar13 = local_578 + lVar18;
        if (local_548.m_capacity < uVar13) {
          mVar6 = mz_zip_array_ensure_capacity(pZip,&local_548,uVar13,1);
          if (mVar6 == 0) goto LAB_004668ce;
          local_570 = local_548.m_p;
        }
        local_548.m_size = uVar13;
        memcpy((void *)(local_578 * (local_548._24_8_ & 0xffffffff) + (long)local_570),psVar21,
               (local_548._24_8_ & 0xffffffff) * lVar18);
        local_578 = uVar13;
      }
      psVar21 = (short *)((long)psVar21 + lVar18);
      uVar7 = (uint)local_590 - (uint)lVar18;
      local_590 = (ulong)uVar7;
      uVar13 = local_548.m_size;
    } while (uVar7 != 0);
  }
  local_49a = (undefined2)uVar13;
  sVar9 = (pArray->m_central_dir).m_size;
  uVar16 = sVar9 + 0x2e;
  if (((pArray->m_central_dir).m_capacity < uVar16) &&
     (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar16,1), mVar6 == 0)) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_548.m_p);
    goto LAB_00466c9d;
  }
  (pArray->m_central_dir).m_size = uVar16;
  uVar16 = (ulong)(pArray->m_central_dir).m_element_size;
  memcpy((void *)(sVar9 * uVar16 + (long)(pArray->m_central_dir).m_p),&local_4b8,uVar16 * 0x2e);
  sVar9 = (pArray->m_central_dir).m_size;
  uVar16 = local_528 + sVar9;
  if (((pArray->m_central_dir).m_capacity < uVar16) &&
     (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar16,1), mVar6 == 0)) {
    pvVar20 = pZip->m_pAlloc_opaque;
    pvVar17 = local_548.m_p;
  }
  else {
    (pArray->m_central_dir).m_size = uVar16;
    if (uVar1 != 0) {
      uVar16 = (ulong)(pArray->m_central_dir).m_element_size;
      memcpy((void *)(sVar9 * uVar16 + (long)(pArray->m_central_dir).m_p),
             (void *)((long)pCentral_dir_header + 0x2e),local_528 * uVar16);
      uVar16 = (pArray->m_central_dir).m_size;
    }
    pvVar17 = local_548.m_p;
    uVar14 = uVar13 + uVar16;
    if ((uVar14 <= (pArray->m_central_dir).m_capacity) ||
       (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar14,1), mVar6 != 0)) {
      (pArray->m_central_dir).m_size = uVar14;
      if (uVar13 != 0) {
        uVar14 = (ulong)(pArray->m_central_dir).m_element_size;
        memcpy((void *)(uVar16 * uVar14 + (long)(pArray->m_central_dir).m_p),pvVar17,uVar13 * uVar14
              );
        uVar14 = (pArray->m_central_dir).m_size;
      }
      uVar16 = local_520 & 0xffffffff;
      uVar13 = uVar14 + uVar16;
      if ((uVar13 <= (pArray->m_central_dir).m_capacity) ||
         (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar13,1), mVar6 != 0)) {
        (pArray->m_central_dir).m_size = uVar13;
        if ((int)local_520 != 0) {
          uVar13 = (ulong)(pArray->m_central_dir).m_element_size;
          memcpy((void *)(uVar14 * uVar13 + (long)(pArray->m_central_dir).m_p),
                 (void *)((long)psVar12 + (local_550 & 0xffffffff)),uVar16 * uVar13);
        }
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pvVar17);
        goto LAB_00466b2d;
      }
    }
    pvVar20 = pZip->m_pAlloc_opaque;
  }
  (*pZip->m_pFree)(pvVar20,pvVar17);
  if ((uVar19 <= (pArray->m_central_dir).m_capacity) ||
     (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar19,0), mVar6 != 0)) {
    (pArray->m_central_dir).m_size = uVar19;
  }
LAB_00466c9d:
  pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *pZip, mz_zip_archive *pSource_zip, mz_uint src_file_index)
{
    mz_uint n, bit_flags, num_alignment_padding_bytes, src_central_dir_following_data_size;
    mz_uint64 src_archive_bytes_remaining, local_dir_header_ofs;
    mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    mz_uint8 new_central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
    size_t orig_central_dir_size;
    mz_zip_internal_state *pState;
    void *pBuf;
    const mz_uint8 *pSrc_central_header;
    mz_zip_archive_file_stat src_file_stat;
    mz_uint32 src_filename_len, src_comment_len, src_ext_len;
    mz_uint32 local_header_filename_size, local_header_extra_len;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pSource_zip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    /* Don't support copying files from zip64 archives to non-zip64, even though in some cases this is possible */
    if ((pSource_zip->m_pState->m_zip64) && (!pZip->m_pState->m_zip64))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Get pointer to the source central dir header and crack it */
    if (NULL == (pSrc_central_header = mz_zip_get_cdh(pSource_zip, src_file_index)))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_SIG_OFS) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    src_filename_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    src_comment_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
    src_ext_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS);
    src_central_dir_following_data_size = src_filename_len + src_ext_len + src_comment_len;

    /* TODO: We don't support central dir's >= MZ_UINT32_MAX bytes right now (+32 fudge factor in case we need to add more extra data) */
    if ((pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + 32) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    if (!pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        /* TODO: Our zip64 support still has some 32-bit limits that may not be worth fixing. */
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    if (!mz_zip_file_stat_internal(pSource_zip, src_file_index, pSrc_central_header, &src_file_stat, NULL))
        return MZ_FALSE;

    cur_src_file_ofs = src_file_stat.m_local_header_ofs;
    cur_dst_file_ofs = pZip->m_archive_size;

    /* Read the source archive's local dir header */
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Compute the total size we need to copy (filename+extra data+compressed data) */
    local_header_filename_size = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    src_archive_bytes_remaining = src_file_stat.m_comp_size + local_header_filename_size + local_header_extra_len ;

    /* Try to find a zip64 extended information field */
    if ((local_header_extra_len) && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX)))
    {
        mz_zip_array file_data_array;
        const mz_uint8 *pExtra_data;
        mz_uint32 extra_size_remaining = local_header_extra_len;

        mz_zip_array_init(&file_data_array, 1);
        if (!mz_zip_array_resize(pZip, &file_data_array, local_header_extra_len, MZ_FALSE))
        {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, src_file_stat.m_local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_size, file_data_array.m_p, local_header_extra_len) != local_header_extra_len)
        {
            mz_zip_array_clear(pZip, &file_data_array);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }

        pExtra_data = (const mz_uint8 *)file_data_array.m_p;

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2)
                {
                    mz_zip_array_clear(pZip, &file_data_array);
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64)); /* may be 0 if there's a descriptor */

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);

        mz_zip_array_clear(pZip, &file_data_array);
    }

    if (!pState->m_zip64)
    {
        /* Try to detect if the new archive will most likely wind up too big and bail early (+(sizeof(mz_uint32) * 4) is for the optional descriptor which could be present, +64 is a fudge factor). */
        /* We also check when the archive is finalized so this doesn't need to be perfect. */
        mz_uint64 approx_new_archive_size = cur_dst_file_ofs + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + src_archive_bytes_remaining + (sizeof(mz_uint32) * 4) +
                                            pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 64;

        if (approx_new_archive_size >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    }

    /* Write dest archive padding */
    if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs, num_alignment_padding_bytes))
        return MZ_FALSE;

    cur_dst_file_ofs += num_alignment_padding_bytes;

    local_dir_header_ofs = cur_dst_file_ofs;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    /* The original zip's local header+ext block doesn't change, even with zip64, so we can just copy it over to the dest zip */
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Copy over the source archive bytes to the dest archive, also ensure we have enough buf space to handle optional data descriptor */
    if (NULL == (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)MZ_MAX(32U, MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining)))))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    while (src_archive_bytes_remaining)
    {
        n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining);
        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }
        cur_src_file_ofs += n;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_dst_file_ofs += n;

        src_archive_bytes_remaining -= n;
    }

    /* Now deal with the optional data descriptor */
    bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    if (bit_flags & 8)
    {
        /* Copy data descriptor */
        if ((pSource_zip->m_pState->m_zip64) || (found_zip64_ext_data_in_ldir))
        {
            /* src is zip64, dest must be zip64 */

            /* name			uint32_t's */
            /* id				1 (optional in zip64?) */
            /* crc			1 */
            /* comp_size	2 */
            /* uncomp_size 2 */
            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, (sizeof(mz_uint32) * 6)) != (sizeof(mz_uint32) * 6))
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID) ? 6 : 5);
        }
        else
        {
            /* src is NOT zip64 */
            mz_bool has_id;

            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            has_id = (MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID);

            if (pZip->m_pState->m_zip64)
            {
                /* dest is zip64, so upgrade the data descriptor */
                const mz_uint8 *pSrc_descriptor = (const mz_uint8 *)pBuf + (has_id ? sizeof(mz_uint32) : 0);
                const mz_uint32 src_crc32 = MZ_READ_LE32(pSrc_descriptor);
                const mz_uint64 src_comp_size = MZ_READ_LE32(pSrc_descriptor + sizeof(mz_uint32));
                const mz_uint64 src_uncomp_size = MZ_READ_LE32(pSrc_descriptor + 2*sizeof(mz_uint32));

                mz_write_le32((mz_uint8 *)pBuf, MZ_ZIP_DATA_DESCRIPTOR_ID);
                mz_write_le32((mz_uint8 *)pBuf + sizeof(mz_uint32) * 1, src_crc32);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 2, src_comp_size);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 4, src_uncomp_size);

                n = sizeof(mz_uint32) * 6;
            }
            else
            {
                /* dest is NOT zip64, just copy it as-is */
                n = sizeof(mz_uint32) * (has_id ? 4 : 3);
            }
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_src_file_ofs += n;
        cur_dst_file_ofs += n;
    }
    pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

    /* Finally, add the new central dir header */
    orig_central_dir_size = pState->m_central_dir.m_size;

    memcpy(new_central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);

    if (pState->m_zip64)
    {
        /* This is the painful part: We need to write a new central dir header + ext block with updated zip64 fields, and ensure the old fields (if any) are not included. */
        const mz_uint8 *pSrc_ext = pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len;
        mz_zip_array new_ext_block;

        mz_zip_array_init(&new_ext_block, sizeof(mz_uint8));

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, MZ_UINT32_MAX);

        if (!mz_zip_writer_update_zip64_extension_block(&new_ext_block, pZip, pSrc_ext, src_ext_len, &src_file_stat.m_comp_size, &src_file_stat.m_uncomp_size, &local_dir_header_ofs, NULL))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return MZ_FALSE;
        }

        MZ_WRITE_LE16(new_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS, new_ext_block.m_size);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_filename_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_ext_block.m_p, new_ext_block.m_size))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len + src_ext_len, src_comment_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        mz_zip_array_clear(pZip, &new_ext_block);
    }
    else
    {
        /* sanity checks */
        if (cur_dst_file_ofs > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        if (local_dir_header_ofs >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, local_dir_header_ofs);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_central_dir_following_data_size))
        {
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }
    }

    /* This shouldn't trigger unless we screwed up during the initial sanity checks */
    if (pState->m_central_dir.m_size >= MZ_UINT32_MAX)
    {
        /* TODO: Support central dirs >= 32-bits in size */
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);
    }

    n = (mz_uint32)orig_central_dir_size;
    if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1))
    {
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    pZip->m_total_files++;
    pZip->m_archive_size = cur_dst_file_ofs;

    return MZ_TRUE;
}